

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool check_result(char *chesses,int row,int col)

{
  bool bVar1;
  
  bVar1 = check_single(chesses,row,col,0,1);
  if (!bVar1) {
    bVar1 = check_single(chesses,row,col,1,0);
    if (!bVar1) {
      bVar1 = check_single(chesses,row,col,1,1);
      if (!bVar1) {
        bVar1 = check_single(chesses,row,col,-1,1);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool check_result(char chesses[], int row, int col) {
    if (check_single(chesses, row, col, 0, 1))
        return true;
    if (check_single(chesses, row, col, 1, 0))
        return true;
    if (check_single(chesses, row, col, 1, 1))
        return true;
    if (check_single(chesses, row, col, -1, 1))
        return true;
    return false;
}